

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O1

int ft_black_new(FT_Memory memory,black_PRaster *araster)

{
  black_PRaster pbVar1;
  FT_Error error;
  int local_1c;
  
  pbVar1 = (black_PRaster)ft_mem_alloc(memory,8,&local_1c);
  if (local_1c == 0) {
    pbVar1->memory = memory;
  }
  *araster = pbVar1;
  return local_1c;
}

Assistant:

static int
  ft_black_new( FT_Memory       memory,
                black_PRaster  *araster )
  {
    FT_Error       error;
    black_PRaster  raster = NULL;


    if ( !FT_NEW( raster ) )
      raster->memory = memory;

    *araster = raster;

    return error;
  }